

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O2

void D_AddWildFile(TArray<FString,_FString> *wadfiles,char *value)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  void *handle;
  char *__src;
  findstate_t findstate;
  char path [4096];
  
  if ((value != (char *)0x0) && (*value != '\0')) {
    pcVar3 = BaseFileSearch(value,".wad",false);
    if (pcVar3 != (char *)0x0) {
      D_AddFile(wadfiles,pcVar3,true,-1);
      return;
    }
    handle = I_FindFirst(value,&findstate);
    strcpy(path,value);
    pcVar3 = strrchr(path,0x2f);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strrchr(path,0x5c);
    }
    if (handle != (void *)0xffffffffffffffff) {
      do {
        uVar1 = I_FindAttr(&findstate);
        if ((uVar1 & 8) == 0) {
          __src = findstate.namelist[findstate.current]->d_name;
          if (pcVar3 != (char *)0x0) {
            strcpy(pcVar3 + 1,__src);
            __src = path;
          }
          D_AddFile(wadfiles,__src,true,-1);
        }
        iVar2 = I_FindNext(handle,&findstate);
      } while (iVar2 == 0);
    }
    I_FindClose(handle);
  }
  return;
}

Assistant:

void D_AddWildFile (TArray<FString> &wadfiles, const char *value)
{
	if (value == NULL || *value == '\0')
	{
		return;
	}
	const char *wadfile = BaseFileSearch (value, ".wad");

	if (wadfile != NULL)
	{
		D_AddFile (wadfiles, wadfile);
	}
	else
	{ // Try pattern matching
		findstate_t findstate;
		char path[PATH_MAX];
		char *sep;
		void *handle = I_FindFirst (value, &findstate);

		strcpy (path, value);
		sep = strrchr (path, '/');
		if (sep == NULL)
		{
			sep = strrchr (path, '\\');
#ifdef _WIN32
			if (sep == NULL && path[1] == ':')
			{
				sep = path + 1;
			}
#endif
		}

		if (handle != ((void *)-1))
		{
			do
			{
				if (!(I_FindAttr(&findstate) & FA_DIREC))
				{
					if (sep == NULL)
					{
						D_AddFile (wadfiles, I_FindName (&findstate));
					}
					else
					{
						strcpy (sep+1, I_FindName (&findstate));
						D_AddFile (wadfiles, path);
					}
				}
			} while (I_FindNext (handle, &findstate) == 0);
		}
		I_FindClose (handle);
	}
}